

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O0

void parse_with_opts_should_require_null_if_requested(void)

{
  cJSON *pcVar1;
  cJSON *item;
  
  pcVar1 = cJSON_ParseWithOpts(anon_var_dwarf_380 + 3,(char **)0x0,1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x41);
  }
  cJSON_Delete(pcVar1);
  pcVar1 = cJSON_ParseWithOpts("{} \n",(char **)0x0,1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x44);
  }
  cJSON_Delete(pcVar1);
  pcVar1 = cJSON_ParseWithOpts("{}x",(char **)0x0,1);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x46);
  }
  return;
}

Assistant:

static void parse_with_opts_should_require_null_if_requested(void)
{
    cJSON *item = cJSON_ParseWithOpts("{}", NULL, true);
    TEST_ASSERT_NOT_NULL(item);
    cJSON_Delete(item);
    item = cJSON_ParseWithOpts("{} \n", NULL, true);
    TEST_ASSERT_NOT_NULL(item);
    cJSON_Delete(item);
    TEST_ASSERT_NULL(cJSON_ParseWithOpts("{}x", NULL, true));
}